

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  undefined1 auStack_88 [120];
  code *pcStack_10;
  
  pcStack_10 = (code *)0x168e96;
  uVar2 = uv_default_loop();
  pcStack_10 = (code *)0x168ea0;
  uv_run(uVar2,0);
  pcStack_10 = (code *)0x168ea5;
  uVar2 = uv_default_loop();
  pcStack_10 = (code *)0x168eb9;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_10 = (code *)0x168ec3;
  uv_run(uVar2,0);
  pcStack_10 = (code *)0x168ec8;
  uVar3 = uv_default_loop();
  pcStack_10 = (code *)0x168ed0;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_10 = run_test_idle_ref;
  run_test_ref_cold_1();
  pcStack_10 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_idle_init(uVar2,auStack_88);
  uv_idle_start(auStack_88,fail_cb2);
  uv_unref(auStack_88);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(auStack_88);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_idle_ref_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x3e,"0 && \"fail_cb2 should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(ref) {
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  MAKE_VALGRIND_HAPPY();
  return 0;
}